

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O1

bool IsKBI19Track(Track *track)

{
  pointer pSVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  vector<Sector,_std::allocator<Sector>_> *pvVar5;
  long lVar6;
  Sector *s;
  pointer this;
  bool bVar7;
  
  iVar3 = Track::size(track);
  if ((iVar3 != 0x14) && (iVar3 = Track::size(track), iVar3 != 0x13)) {
    return false;
  }
  pvVar5 = Track::sectors(track);
  this = (pvVar5->super__Vector_base<Sector,_std::allocator<Sector>_>)._M_impl.
         super__Vector_impl_data._M_start;
  pSVar1 = (pvVar5->super__Vector_base<Sector,_std::allocator<Sector>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  bVar7 = this == pSVar1;
  if (!bVar7) {
    iVar3 = 0;
    do {
      bVar2 = false;
      if ((this->datarate == _250K) && (this->encoding == MFM)) {
        lVar6 = (long)iVar3;
        iVar3 = iVar3 + 1;
        if (((this->header).sector == (uint)""[lVar6]) &&
           (iVar4 = Sector::size(this), iVar4 == 0x200)) {
          bVar2 = Sector::has_good_data(this);
          bVar2 = (this->header).sector == 0x13 || bVar2;
        }
        else {
          bVar2 = false;
        }
      }
      if (!bVar2) {
        return bVar7;
      }
      this = this + 1;
      bVar7 = this == pSVar1;
    } while (!bVar7);
  }
  if (opt.debug != 0) {
    util::operator<<((LogHelper *)&util::cout,(char (*) [23])"detected KBI-19 track\n");
  }
  return bVar7;
}

Assistant:

bool IsKBI19Track(const Track& track)
{
    static const uint8_t ids[]{ 0,1,4,7,10,13,16,2,5,8,11,14,17,3,6,9,12,15,18,19 };

    // CPC version has 19 sectors, PC version has 20 (with bad sector 19).
    if (track.size() != arraysize(ids) && track.size() != arraysize(ids) - 1)
        return false;

    int idx = 0;
    for (auto& s : track.sectors())
    {
        if (s.datarate != DataRate::_250K || s.encoding != Encoding::MFM ||
            s.header.sector != ids[idx++] || s.size() != 512 ||
            (!s.has_good_data() && s.header.sector != 19))
            return false;
    }

    if (opt.debug) util::cout << "detected KBI-19 track\n";
    return true;
}